

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O0

void Sfm_ObjSimulateNode(Abc_Obj_t *pObj)

{
  uint uVar1;
  Sfm_Dec_t *pSVar2;
  word wVar3;
  Sfm_Dec_t *p;
  Abc_Obj_t *pObj_local;
  
  pSVar2 = Sfm_DecMan(pObj);
  if (pSVar2->pPars->fUseSim != 0) {
    uVar1 = Abc_ObjId(pObj);
    wVar3 = Sfm_ObjSimulate(pObj);
    Vec_WrdWriteEntry(&pSVar2->vObjSims,uVar1,wVar3);
    if (((pObj->field_6).iTemp & 0x10U) != 0) {
      uVar1 = Abc_ObjId(pObj);
      wVar3 = Sfm_ObjSimulate2(pObj);
      Vec_WrdWriteEntry(&pSVar2->vObjSims2,uVar1,wVar3);
    }
  }
  return;
}

Assistant:

static inline void Sfm_ObjSimulateNode( Abc_Obj_t * pObj )
{
    Sfm_Dec_t * p = Sfm_DecMan( pObj );
    if ( !p->pPars->fUseSim )
        return;
    Vec_WrdWriteEntry( &p->vObjSims, Abc_ObjId(pObj), Sfm_ObjSimulate(pObj) );
    if ( (pObj->iTemp & SFM_MASK_PIVOT) )
        Vec_WrdWriteEntry( &p->vObjSims2, Abc_ObjId(pObj), Sfm_ObjSimulate2(pObj) );
}